

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quiet_result_printer_tests.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  UnitTestSource *pUVar3;
  Variable *pVVar4;
  TestEventListener *pTVar5;
  int iVar6;
  char **in_R9;
  AssertionResult iutest_ar;
  TestEventListener *in_stack_fffffffffffffc38;
  char *in_stack_fffffffffffffc40;
  AssertionResult local_3b8;
  AssertionHelper local_390;
  Variable *local_360;
  TestEventListener *local_358;
  int local_34c;
  undefined1 local_348 [392];
  int local_1c0;
  undefined1 local_1b8 [392];
  
  local_34c = argc;
  pUVar3 = iutest::UnitTestSource::GetInstance();
  iutest::UnitTestSource::Initialize(pUVar3);
  iutest::TestEnv::ParseCommandLine<char>(&local_34c,argv);
  iutest::TestEnv::LoadFlagFile();
  pUVar3 = iutest::UnitTestSource::GetInstance();
  iutest::UnitTestSource::SetUpDefaultXmlListener(pUVar3);
  iutest::UnitTest::instance();
  pVVar4 = iutest::TestEnv::get_vars();
  pTVar5 = iutest::TestEventListeners::Release
                     (&pVVar4->m_event_listeners,(pVVar4->m_event_listeners).m_default_xml_generator
                     );
  if (pTVar5 != (TestEventListener *)0x0) {
    (*pTVar5->_vptr_TestEventListener[1])(pTVar5);
  }
  if (main::logger == '\0') {
    main_cold_1();
  }
  iutest::detail::iuConsole::GetLoggerInstanceVariable()::sLogger = &main::logger;
  iutest::UnitTest::instance();
  local_360 = iutest::TestEnv::get_vars();
  local_358 = iuutil::QuietResultPrinter::SetUp();
  iutest::internal::NullHelper<false>::CompareNe<iutest::TestEventListener>
            (&local_3b8,"(listener)",local_358);
  bVar1 = local_3b8.m_result;
  iVar6 = 0;
  if (local_3b8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1b8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1b8);
    iutest::detail::iuStreamMessage::iuStreamMessage
              ((iuStreamMessage *)local_348,(iuStreamMessage *)local_1b8);
    local_1c0 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_390,local_3b8.m_message._M_dataplus._M_p,
               (allocator<char> *)&stack0xfffffffffffffc47);
    local_390.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/quiet_result_printer_tests.cpp"
    ;
    local_390.m_part_result.super_iuCodeMessage.m_line = 0x32;
    local_390.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_390,(Fixed *)local_348,false);
    iVar6 = local_1c0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_390.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_390.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_390.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_390.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_348);
    std::ios_base::~ios_base((ios_base *)(local_348 + 0x80));
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
    std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8.m_message._M_dataplus._M_p != &local_3b8.m_message.field_2) {
    operator_delete(local_3b8.m_message._M_dataplus._M_p,
                    local_3b8.m_message.field_2._M_allocated_capacity + 1);
  }
  if (bVar1 != false) {
    iutest::internal::NullHelper<false>::CompareEq<iutest::TestEventListener>
              (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
    bVar1 = local_3b8.m_result;
    if (local_3b8.m_result == false) {
      memset((iu_global_format_stringstream *)local_1b8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1b8);
      iutest::detail::iuStreamMessage::iuStreamMessage
                ((iuStreamMessage *)local_348,(iuStreamMessage *)local_1b8);
      local_1c0 = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_390,local_3b8.m_message._M_dataplus._M_p,
                 (allocator<char> *)&stack0xfffffffffffffc47);
      local_390.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/quiet_result_printer_tests.cpp"
      ;
      local_390.m_part_result.super_iuCodeMessage.m_line = 0x33;
      local_390.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_390,(Fixed *)local_348,false);
      iVar6 = local_1c0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_390.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
          &local_390.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete(local_390.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                        local_390.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_348);
      std::ios_base::~ios_base((ios_base *)(local_348 + 0x80));
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_3b8.m_message._M_dataplus._M_p != &local_3b8.m_message.field_2) {
      operator_delete(local_3b8.m_message._M_dataplus._M_p,
                      local_3b8.m_message.field_2._M_allocated_capacity + 1);
    }
    if (bVar1 != false) {
      pUVar3 = iutest::UnitTestSource::GetInstance();
      iVar2 = iutest::UnitTestSource::Run(pUVar3);
      if (iVar2 == 0) {
        iVar6 = 1;
      }
      else {
        local_348._0_8_ = main::logger.m_log._M_dataplus._M_p;
        iuutil::StrNotInHelper::Assertion<char[13],char_const*>
                  (&local_3b8,(StrNotInHelper *)"\"[       OK ]\"","logger.c_str()","[       OK ]",
                   (char (*) [13])local_348,in_R9);
        bVar1 = local_3b8.m_result;
        if (local_3b8.m_result == false) {
          memset((iu_global_format_stringstream *)local_1b8,0,0x188);
          iutest::iu_global_format_stringstream::iu_global_format_stringstream
                    ((iu_global_format_stringstream *)local_1b8);
          iutest::detail::iuStreamMessage::iuStreamMessage
                    ((iuStreamMessage *)local_348,(iuStreamMessage *)local_1b8);
          local_1c0 = 1;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_390,local_3b8.m_message._M_dataplus._M_p,
                     (allocator<char> *)&stack0xfffffffffffffc47);
          local_390.m_part_result.super_iuCodeMessage.m_file =
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/quiet_result_printer_tests.cpp"
          ;
          local_390.m_part_result.super_iuCodeMessage.m_line = 0x3e;
          local_390.m_part_result.super_iuCodeMessage._44_4_ = 2;
          iutest::AssertionHelper::OnFixed(&local_390,(Fixed *)local_348,false);
          iVar6 = local_1c0;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_390.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
              &local_390.m_part_result.super_iuCodeMessage.m_message.field_2) {
            operator_delete(local_390.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                            local_390.m_part_result.super_iuCodeMessage.m_message.field_2.
                            _M_allocated_capacity + 1);
          }
          std::__cxx11::stringstream::~stringstream((stringstream *)local_348);
          std::ios_base::~ios_base((ios_base *)(local_348 + 0x80));
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b8.m_message._M_dataplus._M_p != &local_3b8.m_message.field_2) {
          operator_delete(local_3b8.m_message._M_dataplus._M_p,
                          local_3b8.m_message.field_2._M_allocated_capacity + 1);
        }
        if (bVar1 != false) {
          local_348._0_8_ = main::logger.m_log._M_dataplus._M_p;
          iuutil::StrInHelper::Assertion<char[13],char_const*>
                    (&local_3b8,(StrInHelper *)"\"[  FAILED  ]\"","logger.c_str()","[  FAILED  ]",
                     (char (*) [13])local_348,in_R9);
          bVar1 = local_3b8.m_result;
          if (local_3b8.m_result == false) {
            memset((iu_global_format_stringstream *)local_1b8,0,0x188);
            iutest::iu_global_format_stringstream::iu_global_format_stringstream
                      ((iu_global_format_stringstream *)local_1b8);
            iutest::detail::iuStreamMessage::iuStreamMessage
                      ((iuStreamMessage *)local_348,(iuStreamMessage *)local_1b8);
            local_1c0 = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_390,local_3b8.m_message._M_dataplus._M_p,
                       (allocator<char> *)&stack0xfffffffffffffc47);
            local_390.m_part_result.super_iuCodeMessage.m_file =
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/quiet_result_printer_tests.cpp"
            ;
            local_390.m_part_result.super_iuCodeMessage.m_line = 0x3f;
            local_390.m_part_result.super_iuCodeMessage._44_4_ = 2;
            iutest::AssertionHelper::OnFixed(&local_390,(Fixed *)local_348,false);
            iVar6 = local_1c0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_390.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
                &local_390.m_part_result.super_iuCodeMessage.m_message.field_2) {
              operator_delete(local_390.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p
                              ,local_390.m_part_result.super_iuCodeMessage.m_message.field_2.
                               _M_allocated_capacity + 1);
            }
            std::__cxx11::stringstream::~stringstream((stringstream *)local_348);
            std::ios_base::~ios_base((ios_base *)(local_348 + 0x80));
            std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
            std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3b8.m_message._M_dataplus._M_p != &local_3b8.m_message.field_2) {
            operator_delete(local_3b8.m_message._M_dataplus._M_p,
                            local_3b8.m_message.field_2._M_allocated_capacity + 1);
          }
          if (bVar1 != false) {
            pTVar5 = iutest::TestEventListeners::Release(&local_360->m_event_listeners,local_358);
            if (pTVar5 != (TestEventListener *)0x0) {
              (*pTVar5->_vptr_TestEventListener[1])(pTVar5);
            }
            iuutil::QuietResultPrinter::SetUp();
            iutest::internal::NullHelper<false>::CompareEq<iutest::TestEventListener>
                      (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
            if (local_3b8.m_result == false) {
              memset((iu_global_format_stringstream *)local_1b8,0,0x188);
              iutest::iu_global_format_stringstream::iu_global_format_stringstream
                        ((iu_global_format_stringstream *)local_1b8);
              iutest::detail::iuStreamMessage::iuStreamMessage
                        ((iuStreamMessage *)local_348,(iuStreamMessage *)local_1b8);
              local_1c0 = 1;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_390,local_3b8.m_message._M_dataplus._M_p,
                         (allocator<char> *)&stack0xfffffffffffffc47);
              local_390.m_part_result.super_iuCodeMessage.m_file =
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/quiet_result_printer_tests.cpp"
              ;
              local_390.m_part_result.super_iuCodeMessage.m_line = 0x46;
              local_390.m_part_result.super_iuCodeMessage._44_4_ = 2;
              iutest::AssertionHelper::OnFixed(&local_390,(Fixed *)local_348,false);
              iVar6 = local_1c0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_390.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
                  &local_390.m_part_result.super_iuCodeMessage.m_message.field_2) {
                operator_delete(local_390.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                _M_p,local_390.m_part_result.super_iuCodeMessage.m_message.field_2.
                                     _M_allocated_capacity + 1);
              }
              std::__cxx11::stringstream::~stringstream((stringstream *)local_348);
              std::ios_base::~ios_base((ios_base *)(local_348 + 0x80));
              std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
              std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3b8.m_message._M_dataplus._M_p != &local_3b8.m_message.field_2) {
              operator_delete(local_3b8.m_message._M_dataplus._M_p,
                              local_3b8.m_message.field_2._M_allocated_capacity + 1);
            }
            if (local_3b8.m_result != false) {
              puts("*** Successful ***");
              iVar6 = 0;
            }
          }
        }
      }
    }
  }
  return iVar6;
}

Assistant:

int main(int argc, char* argv[])
#endif
{
    IUTEST_INIT(&argc, argv);
#if defined(DISABLE_FALSE_POSITIVE_XML)
    // 実行対象テストがないので xml 出力しない
    ::iuutil::ReleaseDefaultXmlGenerator();
#endif

#if !defined(IUTEST_USE_GTEST)
    static TestLogger logger;
    ::iutest::detail::iuConsole::SetLogger(&logger);
#endif

    ::iutest::TestEventListeners& listeners = ::iutest::UnitTest::GetInstance()->listeners();
    ::iutest::TestEventListener* listener = ::iuutil::QuietResultPrinter::SetUp();
#if IUTEST_HAS_ASSERTION_RETURN
    IUTEST_ASSERT_NOTNULL( listener ) << ::iutest::AssertionReturn<int>(1);
    IUTEST_ASSERT_NULL( listeners.default_result_printer() ) << ::iutest::AssertionReturn<int>(1);
#else
    IUTEST_TERMINATE_ON_FAILURE(listener != NULL);
    IUTEST_TERMINATE_ON_FAILURE(listeners.default_result_printer() == NULL);
#endif

    if( IUTEST_RUN_ALL_TESTS() == 0 )
    {
        return 1;
    }
#if !defined(IUTEST_USE_GTEST) && IUTEST_HAS_ASSERTION_RETURN
    IUTEST_ASSERT_STRNOTIN("[       OK ]", logger.c_str()) << ::iutest::AssertionReturn<int>(1);
    IUTEST_ASSERT_STRIN   ("[  FAILED  ]", logger.c_str()) << ::iutest::AssertionReturn<int>(1);
#endif


    delete listeners.Release(listener);
    listener = ::iuutil::QuietResultPrinter::SetUp();
#if IUTEST_HAS_ASSERTION_RETURN
    IUTEST_ASSERT_NULL( listener ) << ::iutest::AssertionReturn<int>(1);
#else
    if( listener != NULL )
    {
        return 1;
    }
#endif

    printf("*** Successful ***\n");
    return 0;
}